

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

char * lws_hdr_simple_ptr(lws *wsi,lws_token_indexes h)

{
  allocated_headers *paVar1;
  
  paVar1 = (wsi->http).ah;
  if ((paVar1 != (allocated_headers *)0x0) && ((ulong)paVar1->frag_index[h] != 0)) {
    return paVar1->data + paVar1->frags[paVar1->frag_index[h]].offset;
  }
  return (char *)0x0;
}

Assistant:

char *lws_hdr_simple_ptr(struct lws *wsi, enum lws_token_indexes h)
{
	int n;

	if (!wsi->http.ah)
		return NULL;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return NULL;

	return wsi->http.ah->data + wsi->http.ah->frags[n].offset;
}